

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  const_reference cVar2;
  uint uVar3;
  uint *cell;
  ostream *poVar4;
  path *__rhs;
  unsigned_long uVar5;
  istream *piVar6;
  _Bit_type *p_Var7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  uint i;
  int iVar9;
  ulong __n;
  uint uVar10;
  uint num_cells;
  allocator_type local_529;
  uint local_528;
  uint num_nets;
  Partitionment partitionment;
  istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> local_4f8;
  Hypergraph hypergraph;
  string cur_str;
  path input_path;
  path output_path;
  istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> local_448;
  ifstream input;
  ofstream output;
  
  if (argc - 4U < 0xfffffffe) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "Usage: ./partioner [path to *.hgr file] [optional max difference]");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar9 = 1;
  }
  else {
    std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
              (&input_path,argv + 1,auto_format);
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::__cxx11::path::filename((path *)&output,&input_path);
    std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
              ((path *)&hypergraph,(char (*) [8])".part.2",auto_format);
    __rhs = (path *)std::filesystem::__cxx11::path::replace_extension((path *)&output);
    std::filesystem::__cxx11::operator/(&output_path,(path *)&input,__rhs);
    std::filesystem::__cxx11::path::~path((path *)&hypergraph);
    std::filesystem::__cxx11::path::~path((path *)&output);
    std::filesystem::__cxx11::path::~path((path *)&input);
    if (argc == 3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&input,argv[2],(allocator<char> *)&output);
      uVar5 = std::__cxx11::stoul((string *)&input,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&input);
      local_528 = 1;
      if (1 < (uint)uVar5) {
        local_528 = (uint)uVar5;
      }
    }
    else {
      local_528 = 1;
    }
    std::ifstream::ifstream(&input,input_path._M_pathname._M_dataplus._M_p,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      poVar4 = std::operator<<((ostream *)&std::cout,"Can not open ");
      pbVar8 = std::filesystem::__cxx11::operator<<
                         ((basic_ostream<char,_std::char_traits<char>_> *)poVar4,&input_path);
      std::endl<char,std::char_traits<char>>((ostream *)pbVar8);
      iVar9 = 1;
    }
    else {
      piVar6 = std::istream::_M_extract<unsigned_int>((uint *)&input);
      std::istream::_M_extract<unsigned_int>((uint *)piVar6);
      Hypergraph::Hypergraph(&hypergraph,num_cells);
      cur_str._M_dataplus._M_p = (pointer)&cur_str.field_2;
      cur_str._M_string_length = 0;
      cur_str.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&input,(string *)&cur_str);
      for (uVar10 = 0; uVar10 < num_nets; uVar10 = uVar10 + 1) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&input,(string *)&cur_str);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&output,(string *)&cur_str,_S_in);
        std::istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long>::istream_iterator
                  (&local_448,(istream_type *)&output);
        local_4f8._M_stream = (istream_type *)0x0;
        local_4f8._M_value = 0;
        local_4f8._M_ok = false;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        vector<std::istream_iterator<unsigned_int,char,std::char_traits<char>,long>,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&partitionment,&local_448,
                   &local_4f8,&local_529);
        for (p_Var7 = partitionment.partitionment_.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            p_Var7 != (_Bit_type *)
                      partitionment.partitionment_.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_;
            p_Var7 = (_Bit_type *)((long)p_Var7 + 4)) {
          *(int *)p_Var7 = (int)*p_Var7 + -1;
        }
        Hypergraph::addNet(&hypergraph,(Net *)&partitionment);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&partitionment);
        std::__cxx11::istringstream::~istringstream((istringstream *)&output);
      }
      std::ifstream::close();
      Partitionment::Partitionment(&partitionment,num_cells);
      uVar10 = Partitionment::getPartitionCost(&partitionment,&hypergraph);
      poVar4 = std::operator<<((ostream *)&std::cout,"Initial cut cost: ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
      while (uVar3 = FM_pass(&hypergraph,&partitionment,local_528), uVar3 != 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Cut cost after pass #");
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,": ");
        uVar10 = uVar10 - uVar3;
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 5;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
        uVar3 = Partitionment::getPartitionCost(&partitionment,&hypergraph);
        if (uVar10 != uVar3) {
          __assert_fail("cost == partitionment.getPartitionCost(hypergraph)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]hypergraph-partitioning/main.cpp"
                        ,0x33,"int main(int, char **)");
        }
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"Final cut cost: ");
      Partitionment::getPartitionCost(&partitionment,&hypergraph);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::ofstream::ofstream(&output,output_path._M_pathname._M_dataplus._M_p,_S_out);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        poVar4 = std::operator<<((ostream *)&std::cout,"Can not open ");
        pbVar8 = std::filesystem::__cxx11::operator<<
                           ((basic_ostream<char,_std::char_traits<char>_> *)poVar4,&output_path);
        std::endl<char,std::char_traits<char>>((ostream *)pbVar8);
        iVar9 = 1;
      }
      else {
        for (__n = 0; __n < num_cells; __n = __n + 1) {
          cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (&partitionment.partitionment_,__n);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&output,(uint)cVar2);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        iVar9 = 0;
        std::ofstream::close();
      }
      std::ofstream::~ofstream(&output);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)&partitionment);
      std::__cxx11::string::~string((string *)&cur_str);
      Hypergraph::~Hypergraph(&hypergraph);
    }
    std::ifstream::~ifstream(&input);
    std::filesystem::__cxx11::path::~path(&output_path);
    std::filesystem::__cxx11::path::~path(&input_path);
  }
  return iVar9;
}

Assistant:

int main(int argc, char *argv[]) {
  if (argc != 2 && argc != 3) {
    std::cout << "Usage: ./partioner [path to *.hgr file] [optional max difference]" << std::endl;
    return 1;
  }
  std::filesystem::path input_path = argv[1],
                        output_path = std::filesystem::current_path() /
                                      input_path.filename().replace_extension(".part.2");
  unsigned max_diff = 1;
  if (argc == 3)
    if (unsigned n = std::stoul(argv[2]))
      max_diff = n;
  // Load hypergraph
  std::ifstream input(input_path.c_str());
  if (!input.is_open()) {
    std::cout << "Can not open " << input_path << std::endl;
    return 1;
  }
  unsigned num_nets, num_cells;
  input >> num_nets >> num_cells;
  Hypergraph hypergraph(num_cells);
  std::string cur_str;
  std::getline(input, cur_str);
  for (unsigned i = 0; i < num_nets; ++i) {
    std::getline(input, cur_str);
    std::istringstream cur_str_buf(cur_str);
    Net cur_net{std::istream_iterator<unsigned>(cur_str_buf), std::istream_iterator<unsigned>()};
    for (unsigned &cell : cur_net)
      --cell;
    hypergraph.addNet(cur_net);
  }
  input.close();
  // Do partioning
  Partitionment partitionment(num_cells);
  unsigned cost = partitionment.getPartitionCost(hypergraph), pass_num = 0;
  std::cout << "Initial cut cost: " << cost << std::endl;
  while (auto cost_reduction = FM_pass(hypergraph, partitionment, max_diff)) {
    cost -= cost_reduction;
    ++pass_num;
    std::cout << "Cut cost after pass #" << std::setw(2) << pass_num << ": " << std::setw(5) << cost
              << std::endl;
    assert(cost == partitionment.getPartitionCost(hypergraph));
  }
  std::cout << "Final cut cost: " << partitionment.getPartitionCost(hypergraph) << std::endl;
  // Save results
  std::ofstream output(output_path.c_str());
  if (!output.is_open()) {
    std::cout << "Can not open " << output_path << std::endl;
    return 1;
  }
  for (unsigned i = 0; i < num_cells; ++i)
    output << +partitionment[i] << std::endl;
  output.close();
  return 0;
}